

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgSequenceOptimizer.cpp
# Opt level: O0

double TasGrid::Optimizer::getValue<(TasGrid::TypeOneDRule)17>
                 (CurrentNodes<(TasGrid::TypeOneDRule)17> *current,double x)

{
  bool bVar1;
  reference pdVar2;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> *this;
  double extraout_XMM0_Qa;
  OptimizerResult OVar3;
  undefined1 local_70 [8];
  CurrentNodes<(TasGrid::TypeOneDRule)15> companion;
  double n;
  const_iterator __end2;
  const_iterator __begin2;
  vector<double,_std::allocator<double>_> *__range2;
  double x_local;
  CurrentNodes<(TasGrid::TypeOneDRule)17> *current_local;
  
  __end2 = ::std::vector<double,_std::allocator<double>_>::begin(&current->nodes);
  n = (double)::std::vector<double,_std::allocator<double>_>::end(&current->nodes);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                                *)&n);
    if (!bVar1) {
      CurrentNodes<(TasGrid::TypeOneDRule)15>::CurrentNodes
                ((CurrentNodes<(TasGrid::TypeOneDRule)15> *)local_70,&current->nodes,x);
      OVar3 = computeMaximum<(TasGrid::TypeOneDRule)15>
                        ((CurrentNodes<(TasGrid::TypeOneDRule)15> *)local_70);
      CurrentNodes<(TasGrid::TypeOneDRule)15>::~CurrentNodes
                ((CurrentNodes<(TasGrid::TypeOneDRule)15> *)local_70);
      return -OVar3.value;
    }
    this = &__end2;
    pdVar2 = __gnu_cxx::
             __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(this);
    companion.coeff.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)*pdVar2;
    ::std::abs((int)this);
    if (extraout_XMM0_Qa < 1e-11) break;
    __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&__end2);
  }
  return -1e+100;
}

Assistant:

double getValue<rule_minlebesgue>(CurrentNodes<rule_minlebesgue> const& current, double x){
    for(auto n : current.nodes) if (std::abs(x - n) < 10 * Maths::num_tol) return -1.E+100;

    CurrentNodes<rule_maxlebesgue> companion(current.nodes, x);
    return - computeMaximum(companion).value;
}